

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

link_type __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
::m_create_node<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
           *this,exception_ptr_error *err,int *args)

{
  bool bVar1;
  node_allocator *alloc;
  undefined1 local_50 [8];
  deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
  guard;
  link_type l;
  node_allocator *node_alloc;
  int *args_local;
  exception_ptr_error *err_local;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
  *this_local;
  
  alloc = rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
          ::m_get_node_allocator
                    ((rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
                      *)this);
  guard.m_size = (size_t)allocator_traits<nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
                         ::allocate<nestl::has_exceptions::exception_ptr_error>
                                   (err,alloc,1,(void *)0x0);
  bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (bVar1) {
    this_local = (rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
                  *)0x0;
  }
  else {
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
    ::deallocation_scoped_guard
              ((deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
                *)local_50,alloc,(rb_tree_node<int> *)guard.m_size,1);
    rb_tree_node<int>::construct_val<nestl::has_exceptions::exception_ptr_error,int>
              ((rb_tree_node<int> *)guard.m_size,err,args);
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar1) {
      this_local = (rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
                    *)0x0;
    }
    else {
      nestl::detail::
      deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
      ::release((deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
                 *)local_50);
      this_local = (rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
                    *)guard.m_size;
    }
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
    ::~deallocation_scoped_guard
              ((deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>_>
                *)local_50);
  }
  return (link_type)this_local;
}

Assistant:

link_type m_create_node(OperationError& err, Args&&... args) NESTL_NOEXCEPT_SPEC
    {
        node_allocator& node_alloc = m_get_node_allocator();
        link_type l = node_allocator_traits::allocate(err, node_alloc, 1);
        if (err)
        {
            return nullptr;
        }

        nestl::detail::deallocation_scoped_guard<link_type, node_allocator> guard(node_alloc, l, 1);

        l->construct_val(err, std::forward<Args>(args)...);
        if (err)
        {
            return nullptr;
        }

        guard.release();
        return l;
    }